

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool ctemplate::HasTemplateChangedOnDisk(char *resolved_filename,time_t mtime,FileStat *statbuf)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,resolved_filename,&local_49);
  bVar1 = File::Stat(&local_48,statbuf);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    bVar1 = mtime < 1 || statbuf->mtime != mtime;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    poVar2 = std::operator<<(poVar2,"Unable to stat file ");
    poVar2 = std::operator<<(poVar2,resolved_filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool HasTemplateChangedOnDisk(const char* resolved_filename,
                              time_t mtime,
                              FileStat* statbuf) {
  if (!File::Stat(resolved_filename, statbuf)) {
    LOG(WARNING) << "Unable to stat file " << resolved_filename << endl;
    // If we can't Stat the file then the file may have been deleted,
    // so reload the template.
    return true;
  }
  if (statbuf->mtime == mtime && mtime > 0) {
    // No need to reload yet.
    return false;
  }
  return true;
}